

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bash_hash.c
# Opt level: O2

void bashHashStepH(void *buf,size_t count,void *state)

{
  size_t count_00;
  ulong count_01;
  void *pvVar1;
  
  count_00 = *(long *)((long)state + 0x180) - *(long *)((long)state + 0x188);
  pvVar1 = (void *)(*(long *)((long)state + 0x188) + (long)state);
  if (count < count_00) {
    memCopy(pvVar1,buf,count);
    *(long *)((long)state + 0x188) = *(long *)((long)state + 0x188) + count;
  }
  else {
    memCopy(pvVar1,buf,count_00);
    pvVar1 = (void *)((long)buf + (*(long *)((long)state + 0x180) - *(long *)((long)state + 0x188)))
    ;
    count_01 = (count - *(long *)((long)state + 0x180)) + *(long *)((long)state + 0x188);
    while( true ) {
      bashF((octet *)state,(void *)((long)state + 400));
      if (count_01 < *(ulong *)((long)state + 0x180)) break;
      memCopy(state,pvVar1,*(ulong *)((long)state + 0x180));
      pvVar1 = (void *)((long)pvVar1 + *(long *)((long)state + 0x180));
      count_01 = count_01 - *(long *)((long)state + 0x180);
    }
    *(ulong *)((long)state + 0x188) = count_01;
    if (count_01 != 0) {
      memCopy(state,pvVar1,count_01);
      return;
    }
  }
  return;
}

Assistant:

void bashHashStepH(const void* buf, size_t count, void* state)
{
	bash_hash_st* st = (bash_hash_st*)state;
	ASSERT(memIsDisjoint2(st, bashHash_keep(), buf, count));
	// не накопился полный буфер?
	if (count < st->buf_len - st->pos)
	{
		memCopy(st->s + st->pos, buf, count);
		st->pos += count;
		return;
	}
	// новый полный буфер
	memCopy(st->s + st->pos, buf, st->buf_len - st->pos);
	buf = (const octet*)buf + st->buf_len - st->pos;
	count -= st->buf_len - st->pos;
	bashF(st->s, st->stack);
	// цикл по полным блокам
	while (count >= st->buf_len)
	{
		memCopy(st->s, buf, st->buf_len);
		buf = (const octet*)buf + st->buf_len;
		count -= st->buf_len;
		bashF(st->s, st->stack);
	}
	// неполный блок?
	if (st->pos = count)
		memCopy(st->s, buf, count);
}